

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::AnsiPortListBuilder
          (AnsiPortListBuilder *this,Scope *scope,
          SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
          *implicitMembers)

{
  Compilation *pCVar1;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
  *implicitMembers_local;
  Scope *scope_local;
  AnsiPortListBuilder *this_local;
  
  pCVar1 = Scope::getCompilation(scope);
  this->comp = pCVar1;
  this->scope = scope;
  this->implicitMembers = implicitMembers;
  this->lastDirection = InOut;
  this->lastType = (DataTypeSyntax *)0x0;
  this->lastNetType = (NetType *)0x0;
  this->lastInterface = (Definition *)0x0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->lastModport);
  this->lastGenericIface = false;
  return;
}

Assistant:

AnsiPortListBuilder(const Scope& scope,
                        SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers) :
        comp(scope.getCompilation()),
        scope(scope), implicitMembers(implicitMembers) {}